

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram.cpp
# Opt level: O3

void __thiscall QNetworkDatagram::QNetworkDatagram(QNetworkDatagram *this)

{
  QNetworkDatagramPrivate *this_00;
  long in_FS_OFFSET;
  QHostAddress local_50;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkDatagramPrivate *)operator_new(0x40);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char *)0x0;
  local_48.d.size = 0;
  QHostAddress::QHostAddress(&local_50);
  QNetworkDatagramPrivate::QNetworkDatagramPrivate(this_00,&local_48,&local_50,0);
  QHostAddress::~QHostAddress(&local_50);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  this->d = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkDatagram::QNetworkDatagram()
    : d(new QNetworkDatagramPrivate)
{
}